

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O0

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>,mp::LinTerms,1>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                 *cc,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          *prepro)

{
  bool bVar1;
  Var r;
  Type TVar2;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  LinTerms *in_RDX;
  long in_RSI;
  double dVar3;
  double dVar4;
  PreprocessInfoStd bnt;
  double rhs;
  Arguments arg1;
  Arguments *algc;
  LinTerms *in_stack_fffffffffffffcd8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffffce0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *in_stack_fffffffffffffce8;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcfc;
  undefined1 fSort;
  AlgConRhs<_1> rr;
  LinTerms *in_stack_fffffffffffffd28;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffd30;
  ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffd38;
  AlgConRhs<_1> local_2c0 [7];
  Arguments *in_stack_fffffffffffffd78;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffffd80;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_c0;
  Arguments *local_20;
  LinTerms *local_18;
  long local_10;
  
  fSort = (undefined1)((uint)in_stack_fffffffffffffcfc >> 0x18);
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = CheckEmptySubCon<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>>
                    (in_stack_fffffffffffffd38,
                     (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                      *)in_stack_fffffffffffffd30,
                     (PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                      *)in_stack_fffffffffffffd28);
  if (!bVar1) {
    PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
    ::narrow_result_bounds
              ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                *)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8,
               (double)in_stack_fffffffffffffce0);
    PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
    ::set_result_type((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                       *)local_18,INTEGER);
    local_20 = CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
               ::GetArguments((CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                               *)(local_10 + 0x28));
    bVar1 = IsNormalized<mp::LinTerms,1>
                      ((ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                        *)in_stack_fffffffffffffce0,
                       (ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                        *)in_stack_fffffffffffffcd8);
    if (bVar1) {
      dVar3 = AlgConRhs<1>::rhs(&local_20->super_AlgConRhs<1>);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::GetBody(local_20);
      BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::ComputeBoundsAndType(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfPreproIneqRHS((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                 *)0x23bc55);
      if ((bVar1) &&
         (TVar2 = PreprocessInfo<int>::get_result_type
                            ((PreprocessInfo<int> *)&stack0xfffffffffffffd20), TVar2 == INTEGER)) {
        in_stack_fffffffffffffce8 =
             (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)floor(dVar3);
        dVar4 = ceil(dVar3);
        if (((double)in_stack_fffffffffffffce8 != dVar4) ||
           (NAN((double)in_stack_fffffffffffffce8) || NAN(dVar4))) {
          in_stack_fffffffffffffce0 =
               (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
               &local_20->super_AlgConRhs<1>;
          dVar4 = ceil(dVar3);
          AlgConRhs<1>::set_rhs((AlgConRhs<1> *)in_stack_fffffffffffffce0,dVar4);
        }
      }
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfPreproIneqResBounds
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)0x23bcd1);
      if (bVar1) {
        dVar4 = PreprocessInfo<int>::lb((PreprocessInfo<int> *)&stack0xfffffffffffffd20);
        if (dVar4 < dVar3) {
          dVar4 = PreprocessInfo<int>::ub((PreprocessInfo<int> *)&stack0xfffffffffffffd20);
          if (dVar4 < dVar3) {
            PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
            ::narrow_result_bounds
                      ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        *)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8,
                       (double)in_stack_fffffffffffffce0);
          }
        }
        else {
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
          ::narrow_result_bounds
                    ((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                      *)in_stack_fffffffffffffcf0,(double)in_stack_fffffffffffffce8,
                     (double)in_stack_fffffffffffffce0);
        }
      }
    }
    else {
      rr.rhs_ = (double)&local_c0;
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::negate
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffce0);
      this_00 = (FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *)AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::GetBody(&local_c0);
      LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      dVar3 = AlgConRhs<1>::rhs(&local_c0.super_AlgConRhs<1>);
      AlgConRhs<-1>::AlgConRhs(local_2c0,dVar3);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)this_00,local_18,rr,
                 (bool)fSort);
      ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
      ConditionalConstraint(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      r = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AssignResultVar2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
                    (this_00,(ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                              *)local_18);
      PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
      ::set_result_var((PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                        *)local_18,r);
      ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
      ~ConditionalConstraint
                ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                  *)0x23bb73);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                (in_stack_fffffffffffffce0);
      LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffce0);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffffce0);
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      ConditionalConstraint<
        AlgebraicConstraint< Body, AlgConRhs<kind> > >& cc,
      PreprocessInfo& prepro) {
    if (CheckEmptySubCon(cc, prepro))
      return;
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    assert(kind);
    auto& algc = cc.GetArguments();
    if (!IsNormalized(cc)) {
      auto arg1 = algc; // Add the normalized one instead
      arg1.negate();    // Negate the terms and sense
      prepro.set_result_var(
            MPD( AssignResultVar2Args(
                   ConditionalConstraint<
                     AlgebraicConstraint< Body, AlgConRhs<
                   -kind> > > { {
                   std::move(arg1.GetBody()), arg1.rhs()
                 } } ) ));
      return;
    }
    // See if we need to round the constant term
    auto rhs = algc.rhs();
    auto bnt = MPD(
          ComputeBoundsAndType(algc.GetBody()) );
    if (MPCD( IfPreproIneqRHS() )
        && var::INTEGER == bnt.get_result_type()
        && std::floor(rhs) != std::ceil(rhs)) {  // rhs not int
      if (1==kind)  // algc is >=
        algc.set_rhs( std::ceil(rhs) );
      else if (-1==kind)
        algc.set_rhs( std::floor(rhs) );
      else if (2==kind)  // algc is >
        algc.set_rhs( std::floor(rhs) ); // > floor(rhs)
      else {
        assert(-2==kind);
        algc.set_rhs( std::ceil(rhs) );
      }
    }
    // Decidable cases
    if (MPCD( IfPreproIneqResBounds() )) {
      if ((1==kind && bnt.lb()>=rhs)
          || (-1==kind && bnt.ub()<=rhs)
          || (2==kind && bnt.lb()>rhs)
          || (-2==kind && bnt.ub()<rhs)) {
        prepro.narrow_result_bounds(1.0, 1.0);   // TRUE
      } else {
        if ((1==kind && bnt.ub()<rhs)
            || (-1==kind && bnt.lb()>rhs)
            || (2==kind && bnt.ub()<=rhs)
            || (-2==kind && bnt.lb()>=rhs)) {
          prepro.narrow_result_bounds(0.0, 0.0);   // FALSE
        }
      }
    }
  }